

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O1

void Eigen::internal::
     triangular_solver_selector<Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_2,_0,_-1>
     ::run(Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *lhs,
          Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *rhs)

{
  long size;
  long otherSize;
  undefined1 auStack_78 [8];
  BlockingType blocking;
  
  size = (lhs->
         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         ).m_rows.m_value;
  otherSize = (rhs->
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              ).
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_cols.m_value;
  blocking.super_level3_blocking<double,_double>.m_blockW =
       (RhsScalar *)
       (rhs->
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       ).
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value;
  blocking.super_level3_blocking<double,_double>.m_blockB = (RhsScalar *)0x0;
  auStack_78 = (undefined1  [8])0x0;
  blocking.super_level3_blocking<double,_double>.m_blockA = (LhsScalar *)0x0;
  blocking.super_level3_blocking<double,_double>.m_mc = otherSize;
  blocking.super_level3_blocking<double,_double>.m_nc = size;
  computeProductBlockingSizes<double,double,4,long>
            (&blocking.super_level3_blocking<double,_double>.m_nc,
             (long *)&blocking.super_level3_blocking<double,_double>.m_blockW,
             &blocking.super_level3_blocking<double,_double>.m_mc);
  blocking.super_level3_blocking<double,_double>.m_kc =
       (long)blocking.super_level3_blocking<double,_double>.m_blockW *
       blocking.super_level3_blocking<double,_double>.m_nc;
  blocking.m_sizeA =
       blocking.super_level3_blocking<double,_double>.m_mc *
       blocking.super_level3_blocking<double,_double>.m_nc;
  blocking.m_sizeB = blocking.super_level3_blocking<double,_double>.m_nc << 3;
  triangular_solve_matrix<double,_long,_1,_2,_false,_0,_0>::run
            (size,otherSize,
             (lhs->
             super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             ).m_data,(lhs->m_stride).super_Stride<_1,_0>.m_outer.m_value,
             (rhs->
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             ).
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data,(rhs->m_stride).super_Stride<_1,_0>.m_outer.m_value,
             (level3_blocking<double,_double> *)auStack_78);
  free((void *)auStack_78);
  free(blocking.super_level3_blocking<double,_double>.m_blockA);
  free(blocking.super_level3_blocking<double,_double>.m_blockB);
  return;
}

Assistant:

static void run(const Lhs& lhs, Rhs& rhs)
  {
    typename internal::add_const_on_value_type<ActualLhsType>::type actualLhs = LhsProductTraits::extract(lhs);

    const Index size = lhs.rows();
    const Index othersize = Side==OnTheLeft? rhs.cols() : rhs.rows();

    typedef internal::gemm_blocking_space<(Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor,Scalar,Scalar,
              Rhs::MaxRowsAtCompileTime, Rhs::MaxColsAtCompileTime, Lhs::MaxRowsAtCompileTime,4> BlockingType;

    BlockingType blocking(rhs.rows(), rhs.cols(), size);

    triangular_solve_matrix<Scalar,Index,Side,Mode,LhsProductTraits::NeedToConjugate,(int(Lhs::Flags) & RowMajorBit) ? RowMajor : ColMajor,
                               (Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor>
      ::run(size, othersize, &actualLhs.coeffRef(0,0), actualLhs.outerStride(), &rhs.coeffRef(0,0), rhs.outerStride(), blocking);
  }